

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::iterate
          (HelperInvocationDerivateCase *this)

{
  size_type *psVar1;
  ostringstream *poVar2;
  ChannelOrder CVar3;
  RenderContext *renderCtx;
  TestLog *log;
  FboHelper *this_00;
  undefined8 *puVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined8 *puVar10;
  long *plVar11;
  int iVar12;
  ulong *puVar13;
  PixelBufferAccess *dst;
  Surface *pSVar14;
  int y;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar15;
  void *extraout_RDX_02;
  void *__buf;
  void *__buf_00;
  int iVar16;
  uint uVar17;
  int iVar18;
  TestLog TVar19;
  undefined8 uVar20;
  int iVar21;
  bool bVar22;
  Surface result;
  ScopedLogSection section;
  string sectionName;
  Random rnd;
  bool local_2aa;
  string local_2a8;
  string local_288;
  Surface local_268;
  TextureFormat local_248;
  int local_240;
  RGBA local_23c;
  int local_238;
  ChannelOrder local_234;
  int local_230;
  uint local_22c;
  int local_228;
  uint local_224;
  ScopedLogSection local_220;
  long local_218;
  TestLog local_210 [2];
  string local_200;
  deRandom local_1e0;
  void *local_1d0 [2];
  HelperInvocationDerivateCase *local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  puVar4 = &local_268.m_pixels.m_cap;
  local_268._0_8_ = puVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Iteration ","");
  iVar16 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,iVar16 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  pvVar15 = (void *)0xf;
  if ((undefined8 *)local_268._0_8_ != puVar4) {
    pvVar15 = (void *)local_268.m_pixels.m_cap;
  }
  if (pvVar15 < (void *)(local_1e0._8_8_ + (long)local_268.m_pixels.m_ptr)) {
    pvVar15 = (void *)0xf;
    if ((void **)local_1e0._0_8_ != local_1d0) {
      pvVar15 = local_1d0[0];
    }
    if (pvVar15 < (void *)(local_1e0._8_8_ + (long)local_268.m_pixels.m_ptr)) goto LAB_01673225;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,local_268._0_8_);
  }
  else {
LAB_01673225:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,local_1e0._0_8_);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_288.field_2._M_allocated_capacity = *puVar13;
    local_288.field_2._8_8_ = puVar10[3];
  }
  else {
    local_288.field_2._M_allocated_capacity = *puVar13;
    local_288._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_288._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  puVar13 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_2a8.field_2._M_allocated_capacity = *puVar13;
    local_2a8.field_2._8_8_ = plVar11[3];
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *puVar13;
    local_2a8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_2a8._M_string_length = plVar11[1];
  *plVar11 = (long)puVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_numIters);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar20 = (qpTestLog *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    uVar20 = local_2a8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < (qpTestLog *)(local_218 + local_2a8._M_string_length)) {
    TVar19.m_log = (qpTestLog *)0xf;
    if (local_220.m_log != local_210) {
      TVar19.m_log = local_210[0].m_log;
    }
    if (TVar19.m_log < (qpTestLog *)(local_218 + local_2a8._M_string_length)) goto LAB_0167338d;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_220,0,(char *)0x0,(ulong)local_2a8._M_dataplus._M_p);
  }
  else {
LAB_0167338d:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_2a8,(ulong)local_220.m_log);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar10[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_200._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_220.m_log != local_210) {
    operator_delete(local_220.m_log,(ulong)((long)&(local_210[0].m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,(ulong)(local_2a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((void **)local_1e0._0_8_ != local_1d0) {
    operator_delete((void *)local_1e0._0_8_,(long)local_1d0[0] + 1);
  }
  if ((undefined8 *)local_268._0_8_ != puVar4) {
    operator_delete((void *)local_268._0_8_,local_268.m_pixels.m_cap + 1);
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Iter","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  uVar20 = (void *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    uVar20 = local_288.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar20 < (void *)((long)local_268.m_pixels.m_ptr + local_288._M_string_length)) {
    pvVar15 = (void *)0xf;
    if ((undefined8 *)local_268._0_8_ != puVar4) {
      pvVar15 = (void *)local_268.m_pixels.m_cap;
    }
    if (pvVar15 < (void *)((long)local_268.m_pixels.m_ptr + local_288._M_string_length))
    goto LAB_01673553;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_268,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
  }
  else {
LAB_01673553:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,local_268._0_8_);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2a8.field_2._M_allocated_capacity = *psVar1;
    local_2a8.field_2._8_8_ = puVar10[3];
  }
  else {
    local_2a8.field_2._M_allocated_capacity = *psVar1;
    local_2a8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_2a8._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_220,log,&local_2a8,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined8 *)local_268._0_8_ != puVar4) {
    operator_delete((void *)local_268._0_8_,local_268.m_pixels.m_cap + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar17 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar17 = (uVar17 >> 4 ^ uVar17) * 0x27d4eb2d;
  deRandom_init(&local_1e0,uVar17 >> 0xf ^ dVar8 ^ uVar17);
  tcu::Surface::Surface(&local_268,0x100,0x100);
  FboHelper::bindForRendering
            ((this->m_fbo).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
             .m_data.ptr);
  (**(code **)(CONCAT44(extraout_var,iVar7) + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(CONCAT44(extraout_var,iVar7) + 0x188))(0x4000);
  drawRandomPrimitives
            (renderCtx,
             (((this->m_program).
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr)->m_program).m_program,this->m_primitiveType,1,(Random *)&local_1e0);
  this_00 = (this->m_fbo).
            super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::FboHelper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::FboHelper>_>
            .m_data.ptr;
  local_2a8._M_dataplus._M_p = (pointer)0x300000008;
  dst = (PixelBufferAccess *)(ulong)(uint)local_268.m_height;
  if ((void *)local_268.m_pixels.m_cap != (void *)0x0) {
    local_268.m_pixels.m_cap = (size_t)local_268.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2a8,local_268.m_width,
             local_268.m_height,1,(void *)local_268.m_pixels.m_cap);
  FboHelper::readPixels(this_00,(int)local_1b0,y,dst);
  local_248 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  uVar17 = 0xfe01;
  if (this->m_numSamples == 0) {
    uVar17 = 0x101;
  }
  if (local_268.m_height < 1) {
    iVar7 = 0;
    iVar16 = 0;
    uVar17 = 0;
  }
  else {
    local_23c.m_value = uVar17 + 0x1000000;
    local_1b8 = (ulong)(uVar17 | 0x1ff0000);
    uVar17 = 0;
    iVar21 = 0;
    iVar16 = 0;
    iVar7 = 0;
    pvVar15 = extraout_RDX;
    local_1c0 = this;
    do {
      if (0 < local_268.m_width) {
        iVar18 = 0;
        do {
          local_240 = iVar18;
          CVar3 = *(ChannelOrder *)
                   ((long)local_268.m_pixels.m_ptr +
                   (long)(local_268.m_width * iVar21 + local_240) * 4);
          local_2aa = true;
          bVar5 = true;
          if (CVar3 != 0xff000000) {
            iVar9 = (CVar3 >> 0x18) - 0xff;
            iVar18 = -iVar9;
            if (0 < iVar9) {
              iVar18 = iVar9;
            }
            local_1b0._0_4_ = CVar3 & 0xffffff | iVar18 << 0x18;
            bVar5 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,local_23c);
            pvVar15 = extraout_RDX_00;
          }
          local_230 = iVar7;
          local_22c = uVar17;
          local_228 = iVar16;
          if (CVar3 != 0xff00ff00) {
            iVar7 = (CVar3 >> 8 & 0xff) - 0xff;
            iVar16 = -iVar7;
            if (0 < iVar7) {
              iVar16 = iVar7;
            }
            iVar18 = (CVar3 >> 0x18) - 0xff;
            iVar7 = -iVar18;
            if (0 < iVar18) {
              iVar7 = iVar18;
            }
            local_1b0._0_4_ = iVar16 << 8 | CVar3 & 0xff0000 | iVar7 << 0x18 | CVar3 & 0xff;
            local_2aa = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,(RGBA)(deUint32)local_1b8);
            pvVar15 = extraout_RDX_01;
          }
          local_234 = CVar3;
          if ((CVar3 & 0xff0000) == R) {
            pvVar15 = (void *)0x0;
          }
          else {
            iVar16 = local_268.m_height;
            pvVar15 = (void *)CONCAT71((int7)((ulong)pvVar15 >> 8),1);
            local_238 = local_268.m_width;
            iVar7 = -1;
            do {
              local_224 = (uint)pvVar15;
              iVar9 = iVar7 + local_240;
              bVar22 = iVar9 < local_238;
              iVar18 = -1;
              do {
                cVar6 = '\x01';
                if (iVar18 == 0 && iVar7 == 0) {
                  cVar6 = '\a';
                }
                if ((iVar18 != 0 || iVar7 != 0) && (bVar22 && -1 < iVar9)) {
                  iVar12 = iVar21 + iVar18;
                  cVar6 = '\x01';
                  if ((-1 < iVar12) && (iVar12 < iVar16)) {
                    iVar12 = *(int *)((long)local_268.m_pixels.m_ptr +
                                     (long)(iVar12 * local_268.m_width + iVar9) * 4);
                    pvVar15 = local_268.m_pixels.m_ptr;
                    if (iVar12 != -0x1000000) {
                      local_1b0._0_8_ = CONCAT44(local_1b0._4_4_,iVar12) ^ 0xff000000;
                      cVar6 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,local_23c);
                      pvVar15 = extraout_RDX_02;
                    }
                  }
                }
                if ((cVar6 != '\a') && (cVar6 != '\0')) {
                  pvVar15 = (void *)(ulong)local_224;
                  goto LAB_01673970;
                }
                iVar18 = iVar18 + 1;
              } while (iVar18 != 2);
              iVar18 = iVar7 + 1;
              pvVar15 = (void *)CONCAT71((int7)((ulong)pvVar15 >> 8),iVar7 < 1);
              iVar7 = iVar18;
            } while (iVar18 != 2);
          }
LAB_01673970:
          bVar22 = (local_234 & 0xff0000) == R;
          iVar7 = local_230 + (uint)!bVar22;
          iVar16 = local_228 + (uint)(byte)((bVar5 & (bVar22 | (byte)pvVar15) | local_2aa) ^ 1);
          uVar17 = local_22c & 0xff;
          if (local_2aa != false) {
            uVar17 = 1;
          }
          iVar18 = local_240 + 1;
        } while (local_240 + 1 < local_268.m_width);
      }
      iVar21 = iVar21 + 1;
      this = local_1c0;
    } while (iVar21 < local_268.m_height);
  }
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_248.order;
  local_1b0._4_4_ = local_248.type;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Found ",6);
  std::ostream::operator<<(poVar2,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,
             " pixels with non-zero derivate (neighbor sample has gl_HelperInvocation = true)",0x4f)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_138);
  if (iVar16 < 1) {
    if ((uVar17 & 1) != 0) {
      poVar2 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = local_248.order;
      local_1b0._4_4_ = local_248.type;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"All result pixels are valid",0x1b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
      goto LAB_01673d97;
    }
    local_2a8._M_string_length = 6;
    local_2a8.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288.field_2._M_allocated_capacity = 0x6920746c75736552;
    local_288._M_string_length = 0xc;
    local_288.field_2._8_5_ = 0x6567616d;
    pSVar14 = &local_268;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2a8,&local_288,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,local_248.order,__buf_00,(size_t)pSVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_4_ = local_248.order;
    local_1b0._4_4_ = local_248.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"ERROR: Result image was empty!",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_2a8._M_string_length = 6;
    local_2a8.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    local_288.field_2._M_allocated_capacity = 0x6920746c75736552;
    local_288._M_string_length = 0xc;
    local_288.field_2._8_5_ = 0x6567616d;
    pSVar14 = &local_268;
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2a8,&local_288,pSVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b0,local_248.order,__buf,(size_t)pSVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = local_248.order;
    local_1b0._4_4_ = local_248.type;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ERROR: Found ",0xd);
    std::ostream::operator<<(poVar2,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2," invalid result pixels!",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Invalid pixels found");
LAB_01673d97:
  iVar16 = this->m_numIters;
  iVar7 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar7;
  tcu::Surface::~Surface(&local_268);
  tcu::TestLog::endSection(local_220.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return (IterateResult)(iVar7 < iVar16);
}

Assistant:

HelperInvocationDerivateCase::IterateResult HelperInvocationDerivateCase::iterate (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const string					sectionName	= string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(m_numIters);
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), (string("Iter") + de::toString(m_iterNdx)), sectionName);
	de::Random						rnd			(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	tcu::Surface					result		(FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	m_fbo->bindForRendering();
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	drawRandomPrimitives(renderCtx, m_program->getProgram(), m_primitiveType, 1, &rnd);

	m_fbo->readPixels(0, 0, result.getAccess());

	if (!verifyHelperInvocationDerivate(m_testCtx.getLog(), result, m_numSamples != 0))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid pixels found");

	m_iterNdx += 1;
	return (m_iterNdx < m_numIters) ? CONTINUE : STOP;
}